

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteArgs<mp::internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> begin,
          ExprIterator<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> end,char *sep,
          int precedence)

{
  undefined8 *puVar1;
  long lVar2;
  size_t __n;
  ulong uVar3;
  char *str;
  ptrdiff_t _Num;
  
  puVar1 = *(undefined8 **)(*(long *)(this + 8) + 8);
  if (puVar1[2] == puVar1[3]) {
    (**(code **)*puVar1)(puVar1,puVar1[2] + 1);
  }
  lVar2 = puVar1[2];
  puVar1[2] = lVar2 + 1;
  *(undefined1 *)(puVar1[1] + lVar2) = 0x28;
  if (begin.ptr_ != end.ptr_) {
    while( true ) {
      ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
      ::Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
               *)this,(LogicalExpr)((ExprBase *)begin.ptr_)->impl_,precedence);
      begin.ptr_ = begin.ptr_ + 1;
      if (begin.ptr_ == end.ptr_) break;
      lVar2 = *(long *)(this + 8);
      __n = strlen(sep);
      puVar1 = *(undefined8 **)(lVar2 + 8);
      uVar3 = puVar1[2] + __n;
      if ((ulong)puVar1[3] < uVar3) {
        (**(code **)*puVar1)(puVar1,uVar3);
      }
      if (__n != 0) {
        memmove((void *)(puVar1[1] + puVar1[2]),sep,__n);
      }
      puVar1[2] = uVar3;
    }
  }
  puVar1 = *(undefined8 **)(*(long *)(this + 8) + 8);
  if (puVar1[2] == puVar1[3]) {
    (**(code **)*puVar1)(puVar1,puVar1[2] + 1);
  }
  lVar2 = puVar1[2];
  puVar1[2] = lVar2 + 1;
  *(undefined1 *)(puVar1[1] + lVar2) = 0x29;
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteArgs(
    Iter begin, Iter end, const char *sep, int precedence) {
  writer_ << '(';
  if (begin != end) {
    Visit(*begin, precedence);
    for (++begin; begin != end; ++begin) {
      writer_ << sep;
      Visit(*begin, precedence);
    }
  }
  writer_ << ')';
}